

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_prngstate(lua_State *L)

{
  uint64_t uVar1;
  double dVar2;
  MSize MVar3;
  GCtab *t;
  TValue *pTVar4;
  GCtab *t_00;
  cTValue *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  PRNGState prng;
  
  t = lj_tab_new(L,8,0);
  uVar1 = (L->glref).ptr64;
  lVar10 = 0x10;
  uVar6 = 0;
  while (uVar6 != 8) {
    if (uVar6 + 1 < (ulong)t->asize) {
      pTVar4 = (TValue *)((t->array).ptr64 + lVar10 + -8);
    }
    else {
      pTVar4 = lj_tab_setinth(L,t,(int)uVar6 + 1);
    }
    pTVar4->n = (double)*(int *)((long)(uVar1 + 0xf08) + uVar6 * 4);
    if (uVar6 + 2 < (ulong)t->asize) {
      pTVar4 = (TValue *)((t->array).ptr64 + lVar10);
    }
    else {
      pTVar4 = lj_tab_setinth(L,t,(int)uVar6 + 2);
    }
    pTVar4->n = (double)*(int *)(uVar1 + 0xf0c + uVar6 * 4);
    lVar10 = lVar10 + 0x10;
    uVar6 = uVar6 + 2;
  }
  pTVar4 = L->top;
  if ((L->base < pTVar4) && (dVar2 = L->base->n, dVar2 != -NAN)) {
    if ((uint)((ulong)dVar2 >> 0x2f) < 0x1fff3) {
      if ((dVar2 != (double)((long)dVar2 & 0xffffffff)) ||
         (NAN(dVar2) || NAN((double)((long)dVar2 & 0xffffffff)))) {
LAB_0014d05d:
        lj_err_arg(L,1,LJ_ERR_PRNGSTATE);
      }
      prng.u[0] = (uint64_t)(int)dVar2;
      for (lVar10 = 1; lVar10 != 4; lVar10 = lVar10 + 1) {
        prng.u[lVar10] = 0;
      }
    }
    else {
      t_00 = lj_lib_checktab(L,1);
      MVar3 = lj_tab_len(t_00);
      if (8 < (int)MVar3) goto LAB_0014d05d;
      uVar7 = 0;
      uVar6 = (ulong)MVar3;
      if ((int)MVar3 < 1) {
        uVar6 = uVar7;
      }
      uVar8 = 1;
      uVar9 = 0;
      for (; uVar6 * 8 != uVar7; uVar7 = uVar7 + 8) {
        if (uVar8 < t_00->asize) {
          pcVar5 = (cTValue *)((t_00->array).ptr64 + uVar7 + 8);
        }
        else {
          pcVar5 = lj_tab_getinth(t_00,(int32_t)uVar8);
        }
        dVar2 = pcVar5->n;
        if (((0xfff8 < (ushort)((ulong)dVar2 >> 0x30)) ||
            (dVar2 != (double)((long)dVar2 & 0xffffffff))) ||
           (NAN(dVar2) || NAN((double)((long)dVar2 & 0xffffffff)))) goto LAB_0014d05d;
        if ((uVar8 & 1) == 0) {
          prng.u[uVar9 >> 1] = prng.u[uVar9 >> 1] | (ulong)(uint)(int)dVar2 << 0x20;
        }
        else {
          prng.u[uVar9 >> 1] = (long)(int)dVar2;
        }
        uVar8 = uVar8 + 1;
        uVar9 = uVar9 + 1;
      }
      for (uVar6 = (ulong)((int)uVar6 + 1U >> 1); uVar6 < 4; uVar6 = uVar6 + 1) {
        prng.u[uVar6] = 0;
      }
    }
    *(uint64_t *)(uVar1 + 0xf18) = prng.u[2];
    *(uint64_t *)(uVar1 + 0xf20) = prng.u[3];
    *(uint64_t *)(uVar1 + 0xf08) = prng.u[0];
    *(uint64_t *)(uVar1 + 0xf10) = prng.u[1];
    pTVar4 = L->top;
  }
  L->top = pTVar4 + 1;
  pTVar4->u64 = (ulong)t | 0xfffa000000000000;
  return 1;
}

Assistant:

LJLIB_CF(jit_prngstate)
{
  GCtab *cur = lj_tab_new(L, 8, 0);

#if LJ_HASJIT
  int i;
  jit_State *J = L2J(L);

  /* The old state. */
  for (i = 1; i <= 4; i++) {
    setintV(lj_tab_setint(L, cur, i*2-1), J->prng.u[i-1] & 0xffffffff);
    setintV(lj_tab_setint(L, cur, i*2), J->prng.u[i-1] >> 32);
  }

  /* We need to set new state using the input array. */
  if (L->base < L->top && !tvisnil(L->base)) {
    PRNGState prng;
    if (tvisnumber(L->base)) {
      TValue *o = L->base;

      if (!tvisint(o) && ((double)(uint32_t)numV(o) != numV(o)))
        lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

      prng.u[0] = numberVint(o);
      for (i = 1; i < 4; i++)
        prng.u[i] = 0;
    } else {
      GCtab *t = lj_lib_checktab(L, 1);
      int i = 1, len = lj_tab_len(t);

      /* The input array must have at most 8 elements. */
      if (len > 8)
        lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

      for (i = 1; i <= len; i++) {
        cTValue *v = lj_tab_getint(t, i);

        if (!tvisint(v) && (!tvisnum(v) || (double)(uint32_t)numV(v) != numV(v)))
          lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

        if (i & 1)
          prng.u[(i-1)/2] = numberVint(v);
        else
          prng.u[(i-1)/2] = prng.u[(i-1)/2] | ((uint64_t)numberVint(v) << 32);
      }
      for (i /= 2; i < 4; i++)
        prng.u[i] = 0;
    }

    /* Re-initialize the JIT prng. */
    J->prng = prng;
  }
#else
  for (int i = 1; i <= 8; i++)
    setintV(lj_tab_setint(L, cur, i), 0);
#endif
  settabV(L, L->top++, cur);
  return 1;
}